

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void check_pseudo_is_top(Proc *proc,Pseudo *pseudo)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)pseudo;
  if ((uVar1 >> 0x14 & 1) != 0) {
    __assert_fail("!pseudo->freed",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0xc5,"void check_pseudo_is_top(Proc *, Pseudo *)");
  }
  uVar2 = (uVar1 & 0xf) - 1;
  if (((uVar2 < 0xb) && ((0x40fU >> (uVar2 & 0x1f) & 1) != 0)) &&
     ((pseudo->field_3).symbol == (LuaSymbol *)0x0)) {
    uVar2 = top_reg((PseudoGenerator *)
                    ((long)(proc->local_pseudos).bits +
                    *(long *)(&DAT_00132510 + (ulong)uVar2 * 8) + -0x58));
    if ((-1 < (int)uVar2) && (uVar2 != (uVar1 >> 4 & 0xffff))) {
      fprintf(_stderr,"Top expected %u, found %u\n",(ulong)uVar2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0xdd,"void check_pseudo_is_top(Proc *, Pseudo *)");
    }
  }
  return;
}

Assistant:

static void check_pseudo_is_top(Proc *proc, Pseudo *pseudo) {
	PseudoGenerator *gen;
	assert(!pseudo->freed);
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		break;
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (pseudo->temp_for_local)
		return;
	int top = top_reg(gen);
	if (top < 0)
		return;
	if (top != pseudo->regnum) {
		fprintf(stderr, "Top expected %u, found %u\n", top, pseudo->regnum);
		assert(false);
	}
}